

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

short anon_unknown.dwarf_66e92::roundtrip<short>(short *in)

{
  short out;
  short *in_stack_00000218;
  short *in_stack_00000220;
  undefined2 local_a;
  
  (anonymous_namespace)::roundtrip_into<short,short>(in_stack_00000220,in_stack_00000218);
  return local_a;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}